

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basictests.cpp
# Opt level: O2

void test64<19ul>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 value [16];
  undefined8 in_RAX;
  ostream *poVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 unaff_RBX;
  ulong uVar7;
  ulong uVar8;
  undefined7 uVar9;
  undefined1 uVar10;
  
  uVar9 = (undefined7)in_RAX;
  poVar3 = std::operator<<((ostream *)&std::cout,"(64-bit) testing ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar8 = 1;
  while( true ) {
    if (uVar8 == 0) {
      return;
    }
    if (uVar8 == 1000000) {
      uVar8 = 0xfffffffffff0bdbf;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar8;
    uVar4 = SUB168(auVar1 * ZEXT816(0xd79435e50d79435f),0);
    uVar6 = uVar8 % 0x13;
    uVar5 = SUB164(auVar1 * ZEXT816(0xd79435e50d79435f),8) & 0xf;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar4;
    uVar7 = (ulong)(uVar5 * 0x13 + SUB164(auVar2 * ZEXT816(0x13),8) >> 4);
    if (((uVar6 == 0) != uVar5 < (uVar4 < 0xd79435e50d79435f)) || (uVar6 != uVar7)) break;
    uVar8 = uVar8 + 1;
  }
  uVar10 = uVar5 < (uVar4 < 0xd79435e50d79435f);
  poVar3 = std::operator<<((ostream *)&std::cerr,"problem with n = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar8);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"quotient: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar8 / 0x13);
  poVar3 = std::operator<<(poVar3," expected: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar8 / 0x13);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"remainder: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar7);
  poVar3 = std::operator<<(poVar3," expected: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar6);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"multiple: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(bool)uVar10);
  poVar3 = std::operator<<(poVar3," expected: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar6 == 0);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"need_fallback = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,false);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"is_power_2    = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,false);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"c             = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xd79435e50d79435f);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"leading_zeroes= ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3b);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"log2_divisor  = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"m             = ");
  value[7] = uVar10;
  value._0_7_ = uVar9;
  value._8_8_ = unaff_RBX;
  operator<<(poVar3,(__uint128_t)value);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"overflow      = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,false);
  std::endl<char,std::char_traits<char>>(poVar3);
  abort();
}

Assistant:

void test64() {
  std::cout << "(64-bit) testing " << divisor << std::endl;
  for (uint64_t n = 1; n != 0; n++) {
    if (n == 1000000) {
      n = 0xFFFFFFFFFFFFFFFF - 1000000;
    }
    bool quotient_ok =
        fast_division::divide64<divisor>::quotient(n) == n / divisor;
    bool remainder_ok =
        fast_division::divide64<divisor>::remainder(n) == n % divisor;
    bool mult_ok =
        fast_division::divide64<divisor>::is_divisible(n) == (n % divisor == 0);
    if (!quotient_ok || !remainder_ok || !mult_ok) {
      std::cerr << "problem with n = " << n << std::endl;
      std::cout << "quotient: " << fast_division::divide64<divisor>::quotient(n)
                << " expected: " << n / divisor << std::endl;
      std::cout << "remainder: "
                << fast_division::divide64<divisor>::remainder(n)
                << " expected: " << n % divisor << std::endl;
      std::cout << "multiple: "
                << fast_division::divide64<divisor>::is_divisible(n)
                << " expected: " << (n % divisor == 0) << std::endl;

      std::cout << "need_fallback = "
                << fast_division::divide64<divisor>::need_fallback << std::endl;
      std::cout << "is_power_2    = "
                << fast_division::divide64<divisor>::is_power_2 << std::endl;
      std::cout << "c             = " << fast_division::divide64<divisor>::c
                << std::endl;
      std::cout << "leading_zeroes= "
                << fast_division::divide64<divisor>::leading_zeroes
                << std::endl;
      std::cout << "log2_divisor  = "
                << fast_division::divide64<divisor>::log2_divisor << std::endl;
      std::cout << "m             = " << fast_division::divide64<divisor>::m
                << std::endl;
      std::cout << "overflow      = "
                << fast_division::divide64<divisor>::overflow << std::endl;

      abort();
    }
  }
}